

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float fVar1;
  float fVar2;
  ImDrawList *this;
  ImVec2 pos_00;
  ImVec2 IVar3;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  ImGuiID id;
  ImU32 IVar7;
  ImGuiWindow *pIVar8;
  ImGuiContext *g;
  char *text;
  uint uVar9;
  float fVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImVec2 size_expected;
  ImRect r_outer;
  ImVec2 pos;
  ImRect total_bb;
  bool local_f5;
  ImGuiID local_f4;
  float local_f0;
  bool local_e9;
  ImRect local_e8;
  ImVec2 local_d8 [3];
  ImGuiCond local_bc;
  undefined1 local_b8 [16];
  char *local_a8;
  ImVec2 local_a0;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  char *local_78;
  ImVec2 local_70;
  ImRect local_68;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar4 = GImGui;
  local_bc = (GImGui->NextWindowData).SizeConstraintCond;
  (GImGui->NextWindowData).SizeConstraintCond = 0;
  pIVar8 = pIVar4->CurrentWindow;
  pIVar8->WriteAccessed = true;
  if (pIVar8->SkipItems != false) {
    return false;
  }
  if ((~flags & 0x60U) == 0) {
    __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_widgets.cpp"
                  ,0x547,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  id = ImGuiWindow::GetID(pIVar8,label,(char *)0x0);
  local_f0 = 0.0;
  if ((flags & 0x20U) == 0) {
    local_f0 = GetFrameHeight();
  }
  IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88._8_4_ = extraout_XMM0_Dc;
  local_88._0_4_ = IVar3.x;
  local_88._4_4_ = IVar3.y;
  local_88._12_4_ = extraout_XMM0_Dd;
  fVar10 = GetNextItemWidth();
  uStack_94 = 0;
  uStack_90 = 0;
  uStack_8c = 0;
  local_98 = local_f0;
  if ((flags & 0x40U) == 0) {
    local_98 = fVar10;
    uStack_94 = extraout_XMM0_Db;
    uStack_90 = extraout_XMM0_Dc_00;
    uStack_8c = extraout_XMM0_Dd_00;
  }
  fVar10 = (pIVar4->Style).FramePadding.y;
  local_e8.Min.x = (pIVar8->DC).CursorPos.x;
  local_e8.Min.y = (pIVar8->DC).CursorPos.y;
  local_e8.Max.x = local_98 + local_e8.Min.x;
  local_e8.Max.y = fVar10 + fVar10 + (float)local_88._4_4_ + local_e8.Min.y;
  local_40.Max.x = 0.0;
  if (0.0 < (float)local_88._0_4_) {
    local_40.Max.x = (pIVar4->Style).ItemInnerSpacing.x + (float)local_88._0_4_;
  }
  local_40.Max.x = local_40.Max.x + local_e8.Max.x;
  local_40.Max.y = local_e8.Max.y + 0.0;
  local_78 = preview_value;
  local_40.Min.x = local_e8.Min.x;
  local_40.Min.y = local_e8.Min.y;
  ItemSize(&local_40,fVar10);
  bVar5 = ItemAdd(&local_40,id,&local_e8);
  if (!bVar5) {
    return false;
  }
  local_a8 = label;
  bVar5 = ButtonBehavior(&local_e8,id,&local_f5,&local_e9,0);
  bVar6 = IsPopupOpen(id);
  IVar7 = GetColorU32(local_f5 + 7,1.0);
  local_b8 = ZEXT416((uint)local_e8.Min.x);
  local_58 = ZEXT416((uint)local_e8.Max.x);
  local_f4 = id;
  RenderNavHighlight(&local_e8,id,1);
  uVar9 = -(uint)((float)local_58._0_4_ - local_f0 <= (float)local_b8._0_4_);
  local_b8._0_4_ = uVar9 & local_b8._0_4_ | ~uVar9 & (uint)((float)local_58._0_4_ - local_f0);
  local_b8._4_4_ = local_58._4_4_ & local_b8._4_4_;
  local_b8._8_4_ = local_58._8_4_ & local_b8._8_4_;
  local_b8._12_4_ = local_58._12_4_ & local_b8._12_4_;
  if ((flags & 0x40U) == 0) {
    local_d8[0].y = local_e8.Max.y;
    local_d8[0].x = (float)local_b8._0_4_;
    ImDrawList::AddRectFilled
              (pIVar8->DrawList,&local_e8.Min,local_d8,IVar7,(pIVar4->Style).FrameRounding,5);
  }
  text = local_a8;
  if ((flags & 0x20U) == 0) {
    this = pIVar8->DrawList;
    local_d8[0].y = local_e8.Min.y;
    local_d8[0].x = (float)local_b8._0_4_;
    IVar7 = GetColorU32(((byte)(local_f5 | bVar6) & 1) + 0x15,1.0);
    ImDrawList::AddRectFilled
              (this,local_d8,&local_e8.Max,IVar7,(pIVar4->Style).FrameRounding,
               (uint)(local_98 <= local_f0) * 5 + 10);
    text = local_a8;
    fVar10 = (pIVar4->Style).FramePadding.y;
    IVar3.y = fVar10 + local_e8.Min.y;
    IVar3.x = fVar10 + (float)local_b8._0_4_;
    RenderArrow(IVar3,3,1.0);
  }
  p_min.y = local_e8.Min.y;
  p_min.x = local_e8.Min.x;
  p_max.y = local_e8.Max.y;
  p_max.x = local_e8.Max.x;
  RenderFrameBorder(p_min,p_max,(pIVar4->Style).FrameRounding);
  if (local_78 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar3 = (pIVar4->Style).FramePadding;
    local_d8[0].x = IVar3.x + local_e8.Min.x;
    local_d8[0].y = IVar3.y + local_e8.Min.y;
    local_68.Min.y = local_e8.Max.y;
    local_68.Min.x = (float)local_b8._0_4_;
    local_a0.x = 0.0;
    local_a0.y = 0.0;
    RenderTextClipped(local_d8,&local_68.Min,local_78,(char *)0x0,(ImVec2 *)0x0,&local_a0,
                      (ImRect *)0x0);
  }
  if (0.0 < (float)local_88._0_4_) {
    pos_00.y = (pIVar4->Style).FramePadding.y + local_e8.Min.y;
    pos_00.x = (pIVar4->Style).ItemInnerSpacing.x + local_e8.Max.x;
    RenderText(pos_00,text,(char *)0x0,true);
  }
  if (bVar5) {
    if (!bVar6) goto LAB_001380a4;
  }
  else if (pIVar4->NavActivateId == local_f4 && !bVar6) {
LAB_001380a4:
    if ((pIVar8->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
      pIVar8->NavLastIds[0] = local_f4;
    }
    OpenPopupEx(local_f4);
  }
  else if (!bVar6) {
    return false;
  }
  if (local_bc != 0) {
    (pIVar4->NextWindowData).SizeConstraintCond = local_bc;
    fVar10 = (pIVar4->NextWindowData).SizeConstraintRect.Min.x;
    uVar9 = -(uint)(local_98 <= fVar10);
    (pIVar4->NextWindowData).SizeConstraintRect.Min.x =
         (float)(~uVar9 & (uint)local_98 | (uint)fVar10 & uVar9);
    goto LAB_001381c4;
  }
  uVar9 = flags | 4;
  if ((flags & 0x1eU) != 0) {
    uVar9 = flags;
  }
  flags = uVar9;
  uVar9 = (flags & 0x1eU) - 1;
  if ((flags & 0x1eU ^ uVar9) <= uVar9) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_widgets.cpp"
                  ,0x57e,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  if ((flags & 4U) == 0) {
    if ((flags & 2U) != 0) {
      fVar10 = 4.0;
      goto LAB_00138165;
    }
    if ((flags & 8U) != 0) {
      fVar10 = 20.0;
      goto LAB_00138165;
    }
    fVar10 = 3.4028235e+38;
  }
  else {
    fVar10 = 8.0;
LAB_00138165:
    fVar1 = (GImGui->Style).WindowPadding.y;
    fVar2 = (GImGui->Style).ItemSpacing.y;
    fVar10 = fVar1 + fVar1 + ((GImGui->FontSize + fVar2) * fVar10 - fVar2);
  }
  local_d8[0].y = 0.0;
  local_d8[0].x = local_98;
  local_68.Min.y = fVar10;
  local_68.Min.x = 3.4028235e+38;
  SetNextWindowSizeConstraints(local_d8,&local_68.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
LAB_001381c4:
  ImFormatString((char *)local_d8,0x10,"##Combo_%02d",(ulong)(uint)(pIVar4->BeginPopupStack).Size);
  pIVar8 = FindWindowByName((char *)local_d8);
  if ((pIVar8 != (ImGuiWindow *)0x0) && (pIVar8->WasActive == true)) {
    local_a0 = CalcWindowExpectedSize(pIVar8);
    if ((flags & 1U) != 0) {
      pIVar8->AutoPosLastDirection = 0;
    }
    local_68 = GetWindowAllowedExtentRect(pIVar8);
    local_70.y = local_e8.Max.y;
    local_70.x = local_e8.Min.x;
    local_48 = FindBestWindowPosForPopupEx
                         (&local_70,&local_a0,&pIVar8->AutoPosLastDirection,&local_68,&local_e8,
                          ImGuiPopupPositionPolicy_ComboBox);
    local_70.x = 0.0;
    local_70.y = 0.0;
    SetNextWindowPos(&local_48,0,&local_70);
  }
  local_68.Min.y = (pIVar4->Style).WindowPadding.y;
  local_68.Min.x = (pIVar4->Style).FramePadding.x;
  PushStyleVar(1,&local_68.Min);
  bVar5 = Begin((char *)local_d8,(bool *)0x0,0x4000143);
  PopStyleVar(1);
  if (!bVar5) {
    EndPopup();
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_widgets.cpp"
                  ,0x59d,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  return true;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    ImGuiCond backup_next_window_size_constraint = g.NextWindowData.SizeConstraintCond;
    g.NextWindowData.SizeConstraintCond = 0;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = GetNextItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button), style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        RenderArrow(ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), ImGuiDir_Down);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (backup_next_window_size_constraint)
    {
        g.NextWindowData.SizeConstraintCond = backup_next_window_size_constraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // Horizontally align ourselves with the framed text
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}